

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_endo_split
               (secp256k1_scalar *s1,secp256k1_scalar *s2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  int iVar1;
  secp256k1_ge *in_RCX;
  undefined4 *in_RDI;
  secp256k1_scalar tmp;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  
  uVar2 = *in_RDI;
  secp256k1_scalar_split_lambda
            ((secp256k1_scalar *)in_RCX,
             (secp256k1_scalar *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),
             (secp256k1_scalar *)0x127117);
  secp256k1_ge_mul_lambda(in_RCX,(secp256k1_ge *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)0x127130);
  if (iVar1 != 0) {
    secp256k1_scalar_negate
              ((secp256k1_scalar *)in_RCX,
               (secp256k1_scalar *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
    secp256k1_ge_neg(in_RCX,(secp256k1_ge *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  }
  iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)0x12715d);
  if (iVar1 != 0) {
    secp256k1_scalar_negate
              ((secp256k1_scalar *)in_RCX,
               (secp256k1_scalar *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
    secp256k1_ge_neg(in_RCX,(secp256k1_ge *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_endo_split(secp256k1_scalar *s1, secp256k1_scalar *s2, secp256k1_ge *p1, secp256k1_ge *p2) {
    secp256k1_scalar tmp = *s1;
    secp256k1_scalar_split_lambda(s1, s2, &tmp);
    secp256k1_ge_mul_lambda(p2, p1);

    if (secp256k1_scalar_is_high(s1)) {
        secp256k1_scalar_negate(s1, s1);
        secp256k1_ge_neg(p1, p1);
    }
    if (secp256k1_scalar_is_high(s2)) {
        secp256k1_scalar_negate(s2, s2);
        secp256k1_ge_neg(p2, p2);
    }
}